

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<int,std::ratio<15l,4l>>,char,void>::spec_handler&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler_&,_char>
                 *handler)

{
  byte bVar1;
  spec_handler *psVar2;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this;
  formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void> *pfVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  byte *pbVar7;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler::
    on_dynamic_width<fmt::v5::internal::auto_id>(handler->handler);
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      uVar6 = 0;
      pbVar5 = (byte *)begin;
      if (bVar1 != 0x30) {
        do {
          if (0xccccccc < uVar6) {
            begin = (char *)(pbVar5 + -1);
            uVar6 = 0x80000000;
            goto LAB_00124dd3;
          }
          uVar6 = ((uint)bVar1 + uVar6 * 10) - 0x30;
          begin = end;
          if (pbVar5 == (byte *)end) break;
          bVar1 = *pbVar5;
          begin = (char *)pbVar5;
          pbVar5 = pbVar5 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        if ((int)uVar6 < 0) {
LAB_00124dd3:
          formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler::
          on_error(handler->handler,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == 0x3a || (*begin == 0x7d)))) {
        psVar2 = handler->handler;
        this = psVar2->context;
        if (this->next_arg_id_ < 1) {
          this->next_arg_id_ = -1;
          pfVar3 = psVar2->f;
          (pfVar3->width_ref).kind = INDEX;
          (pfVar3->width_ref).field_1.index = uVar6;
          return (char *)(byte *)begin;
        }
        error_handler::on_error
                  ((error_handler *)this,"cannot switch from automatic to manual argument indexing")
        ;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar5 = (byte *)(begin + 1);
      do {
        pbVar4 = pbVar5;
        pbVar7 = (byte *)end;
        if (pbVar4 == (byte *)end) break;
        bVar1 = *pbVar4;
        pbVar5 = pbVar4 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar7 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      pfVar3 = handler->handler->f;
      (pfVar3->width_ref).kind = NAME;
      (pfVar3->width_ref).field_1.name.value = begin;
      (pfVar3->width_ref).field_1.name.size = (long)pbVar7 - (long)begin;
      return (char *)pbVar7;
    }
    formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler::on_error
              (handler->handler,"invalid format string");
  }
  return (char *)(byte *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}